

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::
     AddGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
               (AggregateFunctionSet *fun)

{
  AggregateFunction local_140;
  
  GetGenericArgMinMaxFunction<duckdb::VectorArgMinMaxBase<duckdb::LessThan,false,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>>
            ();
  ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>
            (&(fun->super_FunctionSet<duckdb::AggregateFunction>).functions.
              super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>,
             &local_140);
  local_140.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_0196ba98;
  if (local_140.function_info.internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.function_info.internal.
               super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_140.super_BaseScalarFunction);
  return;
}

Assistant:

void AddGenericArgMinMaxFunction(AggregateFunctionSet &fun) {
	fun.AddFunction(GetGenericArgMinMaxFunction<OP>());
}